

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_flag_synonym(parser *p)

{
  wchar_t wVar1;
  long *plVar2;
  char *code_00;
  int local_34;
  wchar_t idx;
  _Bool is_exact;
  char *code;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar2 = (long *)parser_priv(p);
  code_00 = parser_getsym(p,"code");
  wVar1 = parser_getint(p,"exact");
  if (code_00 == (char *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = code_index_in_array(obj_flags,code_00);
  }
  if (plVar2 != (long *)0x0) {
    if (*plVar2 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else if (local_34 < 1) {
      p_local._4_4_ = PARSE_ERROR_INVALID_OBJ_PROP_CODE;
    }
    else {
      *(int *)(*plVar2 + 0x60) = local_34;
      *(bool *)(*plVar2 + 100) = wVar1 != L'\0';
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x19f,"enum parser_error parse_player_timed_flag_synonym(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_flag_synonym(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *code = parser_getsym(p, "code");
	bool is_exact = parser_getint(p, "exact") != 0;
	int idx = (code) ? code_index_in_array(obj_flags, code) : OF_NONE;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (idx <= OF_NONE) {
		return PARSE_ERROR_INVALID_OBJ_PROP_CODE;
	}
	ps->t->oflag_dup = idx;
	ps->t->oflag_syn = is_exact;
	return PARSE_ERROR_NONE;
}